

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O2

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *loop;
  watcher_list *pwVar4;
  watcher_list *pwVar5;
  long *plVar6;
  int iVar7;
  watcher_list *pwVar8;
  size_t sVar9;
  void **ppvVar10;
  int *piVar11;
  watcher_list *pwVar12;
  watcher_list *pwVar13;
  bool bVar14;
  void **ppvVar15;
  watcher_list *pwVar16;
  watcher_list *pwVar17;
  
  if ((handle->flags & 4) != 0) {
    return -0x16;
  }
  loop = handle->loop;
  if (loop->inotify_fd == -1) {
    iVar7 = inotify_init1(0x80800);
    if (iVar7 < 0) {
      piVar11 = __errno_location();
      if (*piVar11 != 0) {
        return -*piVar11;
      }
    }
    else {
      loop->inotify_fd = iVar7;
      uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar7);
      uv__io_start(loop,&loop->inotify_read_watcher,1);
    }
  }
  iVar7 = inotify_add_watch(handle->loop->inotify_fd,path,0xfc6);
  if (iVar7 == -1) {
    piVar11 = __errno_location();
    iVar7 = -*piVar11;
  }
  else {
    pwVar8 = find_watcher(handle->loop,iVar7);
    if (pwVar8 == (watcher_list *)0x0) {
      sVar9 = strlen(path);
      pwVar8 = (watcher_list *)uv__malloc(sVar9 + 0x49);
      if (pwVar8 == (watcher_list *)0x0) {
        return -0xc;
      }
      pwVar8->wd = iVar7;
      memcpy(pwVar8 + 1,path,sVar9 + 1);
      pwVar8->path = (char *)(pwVar8 + 1);
      pwVar8->watchers[0] = pwVar8->watchers;
      pwVar8->watchers[1] = pwVar8->watchers;
      pwVar8->iterating = 0;
      ppvVar10 = &handle->loop->inotify_watchers;
      bVar14 = false;
      pwVar12 = (watcher_list *)0x0;
      pwVar16 = (watcher_list *)ppvVar10;
      while (pwVar16 = (pwVar16->entry).rbe_left, pwVar16 != (watcher_list *)0x0) {
        iVar2 = pwVar16->wd;
        bVar14 = iVar7 < iVar2;
        pwVar12 = pwVar16;
        if (iVar2 <= iVar7) {
          if (iVar7 <= iVar2) goto LAB_0011a934;
          pwVar16 = (watcher_list *)&(pwVar16->entry).rbe_right;
        }
      }
      (pwVar8->entry).rbe_parent = pwVar12;
      (pwVar8->entry).rbe_left = (watcher_list *)0x0;
      (pwVar8->entry).rbe_right = (watcher_list *)0x0;
      (pwVar8->entry).rbe_color = 1;
      ppvVar15 = pwVar12->watchers + ((ulong)((byte)~bVar14 & 1) - 4);
      if (pwVar12 == (watcher_list *)0x0) {
        ppvVar15 = ppvVar10;
      }
      *ppvVar15 = pwVar8;
      pwVar16 = pwVar8;
      while ((pwVar12 != (watcher_list *)0x0 && ((pwVar12->entry).rbe_color == 1))) {
        pwVar4 = (pwVar12->entry).rbe_parent;
        pwVar17 = (pwVar4->entry).rbe_left;
        pwVar13 = pwVar16;
        if (pwVar12 == pwVar17) {
          pwVar5 = (pwVar4->entry).rbe_right;
          if ((pwVar5 != (watcher_list *)0x0) && ((pwVar5->entry).rbe_color == 1)) {
            (pwVar5->entry).rbe_color = 0;
            goto LAB_0011a7d7;
          }
          pwVar5 = (pwVar12->entry).rbe_right;
          if (pwVar5 == pwVar16) {
            pwVar17 = (pwVar5->entry).rbe_left;
            (pwVar12->entry).rbe_right = pwVar17;
            if (pwVar17 == (watcher_list *)0x0) {
              (pwVar5->entry).rbe_parent = pwVar4;
              pwVar17 = (pwVar12->entry).rbe_parent;
LAB_0011a8be:
              ppvVar15 = pwVar17->watchers + ((ulong)(pwVar12 != (pwVar17->entry).rbe_left) - 4);
            }
            else {
              (pwVar17->entry).rbe_parent = pwVar12;
              pwVar17 = (pwVar12->entry).rbe_parent;
              (pwVar5->entry).rbe_parent = pwVar17;
              ppvVar15 = ppvVar10;
              if (pwVar17 != (watcher_list *)0x0) goto LAB_0011a8be;
            }
            *ppvVar15 = pwVar5;
            (pwVar5->entry).rbe_left = pwVar12;
            (pwVar12->entry).rbe_parent = pwVar5;
            pwVar17 = (pwVar4->entry).rbe_left;
            pwVar13 = pwVar12;
            pwVar12 = pwVar16;
          }
          (pwVar12->entry).rbe_color = 0;
          (pwVar4->entry).rbe_color = 1;
          pwVar16 = (pwVar17->entry).rbe_right;
          (pwVar4->entry).rbe_left = pwVar16;
          if (pwVar16 != (watcher_list *)0x0) {
            (pwVar16->entry).rbe_parent = pwVar4;
          }
          pwVar16 = (pwVar4->entry).rbe_parent;
          (pwVar17->entry).rbe_parent = pwVar16;
          ppvVar15 = ppvVar10;
          if (pwVar16 != (watcher_list *)0x0) {
            ppvVar15 = pwVar16->watchers + ((ulong)(pwVar4 != (pwVar16->entry).rbe_left) - 4);
          }
          *ppvVar15 = pwVar17;
          (pwVar17->entry).rbe_right = pwVar4;
          (pwVar4->entry).rbe_parent = pwVar17;
        }
        else if ((pwVar17 == (watcher_list *)0x0) || ((pwVar17->entry).rbe_color != 1)) {
          pwVar17 = (pwVar12->entry).rbe_left;
          if (pwVar17 == pwVar16) {
            pwVar13 = (pwVar17->entry).rbe_right;
            (pwVar12->entry).rbe_left = pwVar13;
            if (pwVar13 == (watcher_list *)0x0) {
              (pwVar17->entry).rbe_parent = pwVar4;
              pwVar13 = (pwVar12->entry).rbe_parent;
LAB_0011a851:
              ppvVar15 = pwVar13->watchers + ((ulong)(pwVar12 != (pwVar13->entry).rbe_left) - 4);
            }
            else {
              (pwVar13->entry).rbe_parent = pwVar12;
              pwVar13 = (pwVar12->entry).rbe_parent;
              (pwVar17->entry).rbe_parent = pwVar13;
              ppvVar15 = ppvVar10;
              if (pwVar13 != (watcher_list *)0x0) goto LAB_0011a851;
            }
            *ppvVar15 = pwVar17;
            (pwVar17->entry).rbe_right = pwVar12;
            (pwVar12->entry).rbe_parent = pwVar17;
            pwVar13 = pwVar12;
            pwVar12 = pwVar16;
          }
          (pwVar12->entry).rbe_color = 0;
          (pwVar4->entry).rbe_color = 1;
          pwVar16 = (pwVar4->entry).rbe_right;
          pwVar12 = (pwVar16->entry).rbe_left;
          (pwVar4->entry).rbe_right = pwVar12;
          if (pwVar12 != (watcher_list *)0x0) {
            (pwVar12->entry).rbe_parent = pwVar4;
          }
          pwVar12 = (pwVar4->entry).rbe_parent;
          (pwVar16->entry).rbe_parent = pwVar12;
          ppvVar15 = ppvVar10;
          if (pwVar12 != (watcher_list *)0x0) {
            ppvVar15 = pwVar12->watchers + ((ulong)(pwVar4 != (pwVar12->entry).rbe_left) - 4);
          }
          *ppvVar15 = pwVar16;
          (pwVar16->entry).rbe_left = pwVar4;
          (pwVar4->entry).rbe_parent = pwVar16;
        }
        else {
          (pwVar17->entry).rbe_color = 0;
LAB_0011a7d7:
          (pwVar12->entry).rbe_color = 0;
          (pwVar4->entry).rbe_color = 1;
          pwVar13 = pwVar4;
        }
        pwVar16 = pwVar13;
        pwVar12 = (pwVar13->entry).rbe_parent;
      }
      *(undefined4 *)((long)*ppvVar10 + 0x18) = 0;
    }
LAB_0011a934:
    uVar3 = handle->flags;
    if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
      puVar1 = &handle->loop->active_handles;
      *puVar1 = *puVar1 + 1;
    }
    handle->watchers[0] = pwVar8->watchers;
    plVar6 = (long *)pwVar8->watchers[1];
    handle->watchers[1] = plVar6;
    *plVar6 = (long)handle->watchers;
    pwVar8->watchers[1] = handle->watchers;
    handle->path = pwVar8->path;
    handle->cb = cb;
    handle->wd = iVar7;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  err = init_inotify(handle->loop);
  if (err)
    return err;

  events = IN_ATTRIB
         | IN_CREATE
         | IN_MODIFY
         | IN_DELETE
         | IN_DELETE_SELF
         | IN_MOVE_SELF
         | IN_MOVED_FROM
         | IN_MOVED_TO;

  wd = inotify_add_watch(handle->loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(handle->loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  QUEUE_INIT(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, CAST(&handle->loop->inotify_watchers), w);

no_insert:
  uv__handle_start(handle);
  QUEUE_INSERT_TAIL(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}